

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTcpServer.cpp
# Opt level: O0

void __thiscall xs::TcpServer::deleteDoneConnections(TcpServer *this)

{
  bool bVar1;
  reference ppCVar2;
  __normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
  local_28;
  __normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
  local_20;
  iterator i;
  ScopedLock lock;
  TcpServer *this_local;
  
  de::ScopedLock::ScopedLock((ScopedLock *)&i,&this->m_connectionListLock);
  local_20._M_current =
       (ConnectionHandler **)
       std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::begin
                 (&this->m_doneConnections);
  while( true ) {
    local_28._M_current =
         (ConnectionHandler **)
         std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::end
                   (&this->m_doneConnections);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
              ::operator*(&local_20);
    if (*ppCVar2 != (ConnectionHandler *)0x0) {
      (*((*ppCVar2)->super_Thread)._vptr_Thread[1])();
    }
    __gnu_cxx::
    __normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
    ::operator++(&local_20,0);
  }
  std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::clear
            (&this->m_doneConnections);
  de::ScopedLock::~ScopedLock((ScopedLock *)&i);
  return;
}

Assistant:

void TcpServer::deleteDoneConnections (void)
{
	de::ScopedLock lock(m_connectionListLock);

	for (std::vector<ConnectionHandler*>::iterator i = m_doneConnections.begin(); i != m_doneConnections.end(); i++)
		delete *i;

	m_doneConnections.clear();
}